

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::Renderable::Create(Renderable *this,uint32_t width,uint32_t height,bool filter,bool clamp)

{
  Decal *pDVar1;
  _Head_base<0UL,_olc::Sprite_*,_false> _Var2;
  bool local_39;
  _Head_base<0UL,_olc::Sprite_*,_false> local_38;
  uint32_t local_30;
  uint32_t local_2c;
  _Head_base<0UL,_olc::Sprite_*,_false> local_28;
  
  local_39 = filter;
  local_30 = height;
  local_2c = width;
  std::make_unique<olc::Sprite,unsigned_int&,unsigned_int&>((uint *)&local_38,&local_2c);
  _Var2._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (Sprite *)0x0;
  std::__uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>::reset
            ((__uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_> *)this,
             _Var2._M_head_impl);
  std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::~unique_ptr
            ((unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_> *)&local_38);
  local_28._M_head_impl =
       (this->pSprite)._M_t.super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>.
       _M_t.super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
       super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl;
  std::make_unique<olc::Decal,olc::Sprite*,bool&,bool&>
            (&local_38._M_head_impl,(bool *)&local_28,&local_39);
  _Var2._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (Sprite *)0x0;
  pDVar1 = (this->pDecal)._M_t.super___uniq_ptr_impl<olc::Decal,_std::default_delete<olc::Decal>_>.
           _M_t.super__Tuple_impl<0UL,_olc::Decal_*,_std::default_delete<olc::Decal>_>.
           super__Head_base<0UL,_olc::Decal_*,_false>._M_head_impl;
  (this->pDecal)._M_t.super___uniq_ptr_impl<olc::Decal,_std::default_delete<olc::Decal>_>._M_t.
  super__Tuple_impl<0UL,_olc::Decal_*,_std::default_delete<olc::Decal>_>.
  super__Head_base<0UL,_olc::Decal_*,_false>._M_head_impl = (Decal *)_Var2._M_head_impl;
  if (pDVar1 != (Decal *)0x0) {
    (*pDVar1->_vptr_Decal[1])();
    if (local_38._M_head_impl != (Sprite *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  return;
}

Assistant:

void Renderable::Create(uint32_t width, uint32_t height, bool filter, bool clamp)
	{
		pSprite = std::make_unique<olc::Sprite>(width, height);
		pDecal = std::make_unique<olc::Decal>(pSprite.get(), filter, clamp);
	}